

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

yy_state_type __thiscall yyFlexLexer::yy_get_previous_state(yyFlexLexer *this)

{
  int iVar1;
  int iVar2;
  byte *pbVar3;
  long lVar4;
  byte bVar5;
  bool bVar6;
  
  iVar2 = this->yy_start;
  pbVar3 = (byte *)(this->super_FlexLexer).yytext;
LAB_00108ce4:
  if (this->yy_c_buf_p <= pbVar3) {
    return iVar2;
  }
  if ((ulong)*pbVar3 == 0) {
    bVar5 = 1;
  }
  else {
    bVar5 = ""[*pbVar3];
  }
  if (yy_accept[iVar2] != 0) {
    this->yy_last_accepting_state = iVar2;
    this->yy_last_accepting_cpos = (char *)pbVar3;
  }
  do {
    iVar1 = iVar2;
    do {
      lVar4 = (long)yy_base[iVar1] + (ulong)bVar5;
      if (iVar1 == yy_chk[lVar4]) {
        iVar2 = (int)yy_nxt[lVar4];
        pbVar3 = pbVar3 + 1;
        goto LAB_00108ce4;
      }
      iVar2 = (int)yy_def[iVar1];
    } while ((iVar1 != 0x2c) && (bVar6 = iVar1 != 0x10, iVar1 = iVar2, bVar6));
    bVar5 = ""[bVar5];
  } while( true );
}

Assistant:

yy_state_type yyFlexLexer::yy_get_previous_state()
/* %endif */
{
	yy_state_type yy_current_state;
	char *yy_cp;
    
/* %% [15.0] code to get the start state into yy_current_state goes here */
	yy_current_state = (yy_start);

	for ( yy_cp = (yytext_ptr) + YY_MORE_ADJ; yy_cp < (yy_c_buf_p); ++yy_cp )
		{
/* %% [16.0] code to find the next state goes here */
		YY_CHAR yy_c = (*yy_cp ? yy_ec[YY_SC_TO_UI(*yy_cp)] : 1);
		if ( yy_accept[yy_current_state] )
			{
			(yy_last_accepting_state) = yy_current_state;
			(yy_last_accepting_cpos) = yy_cp;
			}
		while ( yy_chk[yy_base[yy_current_state] + yy_c] != yy_current_state )
			{
			yy_current_state = (int) yy_def[yy_current_state];
			if ( yy_current_state >= 76 )
				yy_c = yy_meta[yy_c];
			}
		yy_current_state = yy_nxt[yy_base[yy_current_state] + yy_c];
		}

	return yy_current_state;
}